

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O3

bool deqp::egl::SurfaceConfig::compareColorBufferBits
               (SurfaceConfig *a,SurfaceConfig *b,BVec4 *specifiedRGBColors,
               BVec2 *specifiedLuminanceColors,bool yuvPlaneBppSpecified)

{
  deUint32 dVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [13];
  uint5 uVar5;
  undefined1 auVar6 [13];
  int iVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  
  dVar1 = (a->m_info).colorBufferType;
  if (dVar1 == 0x3300) {
    return (b->m_info).yuvPlaneBpp < (a->m_info).yuvPlaneBpp && yuvPlaneBppSpecified;
  }
  if (dVar1 == 0x308f) {
    iVar8 = (a->m_info).alphaSize * (uint)specifiedLuminanceColors->m_data[1] +
            (a->m_info).luminanceSize * (uint)specifiedLuminanceColors->m_data[0];
    iVar7 = (uint)specifiedLuminanceColors->m_data[1] * (b->m_info).alphaSize +
            (uint)specifiedLuminanceColors->m_data[0] * (b->m_info).luminanceSize;
    bVar10 = SBORROW4(iVar8,iVar7);
    iVar11 = iVar8 - iVar7;
    bVar9 = iVar8 == iVar7;
  }
  else {
    if (dVar1 != 0x308e) {
      return true;
    }
    uVar2 = *(uint *)specifiedRGBColors->m_data;
    auVar4[0xc] = (char)(uVar2 >> 0x18);
    auVar4._0_12_ = ZEXT712(0);
    uVar5 = CONCAT32(auVar4._10_3_,(ushort)(byte)(uVar2 >> 0x10));
    auVar6._5_8_ = 0;
    auVar6._0_5_ = uVar5;
    iVar11 = (int)CONCAT72(SUB137(auVar6 << 0x40,6),(ushort)(byte)(uVar2 >> 8));
    iVar8 = (int)uVar5;
    uVar3 = (uint)(uint3)(auVar4._10_3_ >> 0x10);
    iVar7 = (a->m_info).alphaSize * uVar3 + (a->m_info).blueSize * iVar8 +
            (a->m_info).greenSize * iVar11 + (a->m_info).redSize * (uVar2 & 0xff);
    iVar8 = uVar3 * (b->m_info).alphaSize + iVar8 * (b->m_info).blueSize +
            iVar11 * (b->m_info).greenSize + (uVar2 & 0xff) * (b->m_info).redSize;
    bVar10 = SBORROW4(iVar7,iVar8);
    iVar11 = iVar7 - iVar8;
    bVar9 = iVar7 == iVar8;
  }
  return !bVar9 && bVar10 == iVar11 < 0;
}

Assistant:

static bool compareColorBufferBits (const SurfaceConfig& a, const SurfaceConfig& b, const tcu::BVec4& specifiedRGBColors, const tcu::BVec2& specifiedLuminanceColors, bool yuvPlaneBppSpecified)
	{
		DE_ASSERT(a.m_info.colorBufferType == b.m_info.colorBufferType);
		switch (a.m_info.colorBufferType)
		{
			case EGL_RGB_BUFFER:
			{
				const tcu::IVec4	mask	(specifiedRGBColors.cast<deInt32>());

				return (a.m_info.redSize * mask[0] + a.m_info.greenSize * mask[1] + a.m_info.blueSize * mask[2] + a.m_info.alphaSize * mask[3])
						> (b.m_info.redSize * mask[0] + b.m_info.greenSize * mask[1] + b.m_info.blueSize * mask[2] + b.m_info.alphaSize * mask[3]);
			}

			case EGL_LUMINANCE_BUFFER:
			{
				const tcu::IVec2	mask	(specifiedLuminanceColors.cast<deInt32>());

				return (a.m_info.luminanceSize * mask[0] + a.m_info.alphaSize * mask[1]) > (b.m_info.luminanceSize * mask[0] + b.m_info.alphaSize * mask[1]);
			}

			case EGL_YUV_BUFFER_EXT:
				return yuvPlaneBppSpecified ? (a.m_info.yuvPlaneBpp > b.m_info.yuvPlaneBpp) : false;

			default:
				DE_ASSERT(DE_FALSE);
				return true;
		}
	}